

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsthandl.c
# Opt level: O0

LispPTR N_OP_listget(LispPTR plist,LispPTR tos)

{
  LispPTR LVar1;
  cadr_cell cVar2;
  LispPTR parm_1;
  LispPTR LStack_1c;
  LispPTR parm;
  cadr_cell cadrobj;
  LispPTR tos_local;
  LispPTR plist_local;
  
  cadrobj.cdr_cell = plist;
  while( true ) {
    if (cadrobj.cdr_cell == 0) {
      return 0;
    }
    if ((*(ushort *)((ulong)(MDStypetbl + (cadrobj.cdr_cell >> 9)) ^ 2) & 0x7ff) != 5) {
      MachineState.tosvalue = tos;
      MachineState.scratch_cstk = cadrobj.cdr_cell;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
    cVar2 = cadr(cadrobj.cdr_cell);
    LStack_1c = cVar2.car_cell;
    parm = cVar2.cdr_cell;
    if (LStack_1c == tos) break;
    if ((*(ushort *)((ulong)(MDStypetbl + (parm >> 9)) ^ 2) & 0x7ff) != 5) {
      return 0;
    }
    if ((*(ushort *)((ulong)(MDStypetbl + (parm >> 9)) ^ 2) & 0x7ff) != 5) {
      MachineState.tosvalue = tos;
      MachineState.scratch_cstk = cadrobj.cdr_cell;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
    cVar2 = cadr(parm);
    parm = cVar2.cdr_cell;
    cadrobj.cdr_cell = parm;
    if (MachineState.irqend == 0) {
      MachineState.errorexit = 1;
      MachineState.scratch_cstk = parm;
      MachineState.tosvalue = tos;
      return 0xfffffffe;
    }
  }
  if (parm == 0) {
    return 0;
  }
  if ((*(ushort *)((ulong)(MDStypetbl + (parm >> 9)) ^ 2) & 0x7ff) == 5) {
    LVar1 = car(parm);
    return LVar1;
  }
  MachineState.tosvalue = tos;
  MachineState.scratch_cstk = cadrobj.cdr_cell;
  MachineState.errorexit = 1;
  return 0xffffffff;
}

Assistant:

LispPTR N_OP_listget(LispPTR plist, LispPTR tos) {
  struct cadr_cell cadrobj;

  while (plist != NIL_PTR) {
    S_N_CHECKANDCADR2(plist, cadrobj, tos, plist);

    if (cadrobj.car_cell == tos) {
      if (cadrobj.cdr_cell == NIL_PTR) return NIL_PTR;

      if (Listp(cadrobj.cdr_cell))
        return (car(cadrobj.cdr_cell));
      else /* must punt in case car/cdrerr */
        SAVE_ERROR_EXIT2(plist, tos);
    }

    if (!Listp(cadrobj.cdr_cell)) { /* this list ended before we found prop */
      return (NIL_PTR);
    }

    S_N_CHECKANDCADR2(cadrobj.cdr_cell, cadrobj, tos, plist);
    plist = cadrobj.cdr_cell;

    if (!Irq_Stk_End) {
      /* for continuation, it becomes plist on next time */
      Scratch_CSTK = plist;
      TIMER_EXIT(tos);
    }
  }

  return (NIL_PTR);

}